

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  char *pcVar2;
  int iVar3;
  FieldDescriptor *this_00;
  Descriptor *pDVar4;
  undefined4 extraout_var;
  TcParseTableBase *pTVar5;
  EnumDescriptor *pEVar6;
  bool bVar7;
  string_view str;
  string_view v;
  LogMessage LStack_28;
  
  this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (this_00 != (FieldDescriptor *)0x0) {
    output->type = this_00->type_;
    bVar7 = (bool)((this_00->field_0x1 & 0x20) >> 5);
    if (0xbf < (byte)this_00->field_0x1 != bVar7) {
      Find();
LAB_001e10a3:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_28);
    }
    output->is_repeated = bVar7;
    bVar7 = FieldDescriptor::is_packed(this_00);
    output->is_packed = bVar7;
    output->descriptor = this_00;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 8) {
      (output->field_6).enum_validity_check.func = ValidateEnumUsingDescriptor;
      pEVar6 = FieldDescriptor::enum_type(this_00);
      (output->field_6).message_info.tc_table = (TcParseTableBase *)pEVar6;
    }
    else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 10) {
      pMVar1 = this->factory_;
      pDVar4 = FieldDescriptor::message_type(this_00);
      iVar3 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar4);
      (output->field_6).message_info.prototype = (MessageLite *)CONCAT44(extraout_var,iVar3);
      pTVar5 = MessageLite::GetTcParseTable((MessageLite *)CONCAT44(extraout_var,iVar3));
      (output->field_6).message_info.tc_table = pTVar5;
      if ((output->field_6).enum_validity_check.func == (EnumValidityFuncWithArg *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x11d,"output->message_info.prototype != nullptr");
        str._M_str = "Extension factory\'s GetPrototype() returned nullptr; extension: ";
        str._M_len = 0x40;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&LStack_28,str);
        pcVar2 = (this_00->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
        v._M_str = pcVar2 + ~v._M_len;
        absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,v);
        goto LAB_001e10a3;
      }
    }
  }
  return this_00 != (FieldDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == nullptr) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->is_packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      output->message_info.tc_table =
          output->message_info.prototype->GetTcParseTable();
      ABSL_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned nullptr; extension: "
          << extension->full_name();

    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}